

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O0

ER __thiscall
slang::ast::RepeatLoopStatement::evalImpl(RepeatLoopStatement *this,EvalContext *context)

{
  SourceRange range;
  bool bVar1;
  SVInt *this_00;
  Diagnostic *this_01;
  Diagnostic *arg;
  long *plVar2;
  optional<long> oVar3;
  ER result;
  int64_t i;
  int64_t c;
  Diagnostic *diag;
  optional<long> oc;
  ConstantValue cv;
  undefined4 in_stack_fffffffffffffef8;
  ER in_stack_fffffffffffffefc;
  EvalContext *in_stack_ffffffffffffff00;
  Expression *in_stack_ffffffffffffff08;
  optional<long> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  SVInt *in_stack_ffffffffffffff20;
  bool local_d2;
  EvalContext *this_02;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff54;
  SourceLocation in_stack_ffffffffffffff58;
  long lVar5;
  undefined8 in_stack_ffffffffffffff60;
  DiagCode code;
  long lVar6;
  __unspec local_69;
  undefined4 local_68;
  type local_61;
  _Storage<long,_true> local_60;
  undefined1 local_58;
  undefined4 local_50;
  ER local_4;
  
  code = SUB84((ulong)in_stack_ffffffffffffff60 >> 0x20,0);
  this_02 = (EvalContext *)&stack0xffffffffffffffc0;
  Expression::eval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  bVar1 = slang::ConstantValue::bad((ConstantValue *)0xa46b5c);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff50);
  if (bVar1) {
    local_4 = Fail;
  }
  else {
    slang::ConstantValue::integer((ConstantValue *)0xa46bba);
    oVar3 = SVInt::as<long>(in_stack_ffffffffffffff20);
    local_60._M_value =
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    local_58 = oVar3.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional<long> *)0xa46bfb);
    local_d2 = true;
    if (bVar1) {
      local_68 = 0;
      local_61 = (type)std::operator<=><long,_int>
                                 ((optional<long> *)
                                  CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                                  (int *)in_stack_ffffffffffffff10);
      std::__cmp_cat::__unspec::__unspec(&local_69,(__unspec *)0x0);
      local_d2 = std::operator<(local_61);
    }
    if (local_d2 != false) {
      this_00 = slang::ConstantValue::integer((ConstantValue *)0xa46c77);
      bVar1 = SVInt::hasUnknown(this_00);
      if (!bVar1) {
        range.startLoc._4_4_ = in_stack_ffffffffffffff54;
        range.startLoc._0_4_ = uVar4;
        range.endLoc = in_stack_ffffffffffffff58;
        this_01 = EvalContext::addDiag(this_02,code,range);
        arg = Diagnostic::operator<<
                        ((Diagnostic *)in_stack_ffffffffffffff00,
                         (ConstantValue *)
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        Diagnostic::operator<<<int>(this_01,(int)((ulong)arg >> 0x20));
        Diagnostic::operator<<<long>(this_01,(long)arg);
        local_4 = Fail;
        goto LAB_00a46e17;
      }
      std::optional<long>::operator=(in_stack_ffffffffffffff10,(int *)in_stack_ffffffffffffff08);
    }
    plVar2 = std::optional<long>::operator*((optional<long> *)0xa46d7b);
    lVar6 = *plVar2;
    for (lVar5 = 0; lVar5 < lVar6; lVar5 = lVar5 + 1) {
      in_stack_fffffffffffffefc =
           Statement::eval((Statement *)in_stack_ffffffffffffff00,
                           (EvalContext *)
                           CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      if (in_stack_fffffffffffffefc != Success) {
        if (in_stack_fffffffffffffefc == Break) break;
        local_4 = in_stack_fffffffffffffefc;
        if (in_stack_fffffffffffffefc != Continue) goto LAB_00a46e17;
      }
    }
    local_4 = Success;
  }
LAB_00a46e17:
  local_50 = 1;
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xa46e24);
  return local_4;
}

Assistant:

ER RepeatLoopStatement::evalImpl(EvalContext& context) const {
    auto cv = count.eval(context);
    if (cv.bad())
        return ER::Fail;

    std::optional<int64_t> oc = cv.integer().as<int64_t>();
    if (!oc || oc < 0) {
        if (cv.integer().hasUnknown())
            oc = 0;
        else {
            auto& diag = context.addDiag(diag::ValueOutOfRange, count.sourceRange);
            diag << cv << 0 << INT64_MAX;
            return ER::Fail;
        }
    }

    int64_t c = *oc;
    for (int64_t i = 0; i < c; i++) {
        ER result = body.eval(context);
        if (result != ER::Success) {
            if (result == ER::Break)
                break;
            else if (result != ER::Continue)
                return result;
        }
    }

    return ER::Success;
}